

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O0

void __thiscall Catch::RunContext::populateReaction(RunContext *this,AssertionReaction *reaction)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  bool local_19;
  AssertionReaction *reaction_local;
  RunContext *this_local;
  
  peVar3 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->m_config);
  iVar2 = (*(peVar3->super_NonCopyable)._vptr_NonCopyable[6])();
  reaction->shouldDebugBreak = (bool)((byte)iVar2 & 1);
  bVar1 = aborting(this);
  local_19 = true;
  if (!bVar1) {
    local_19 = ((this->m_lastAssertionInfo).resultDisposition & Normal) != 0;
  }
  reaction->shouldThrow = local_19;
  return;
}

Assistant:

void RunContext::populateReaction( AssertionReaction& reaction ) {
        reaction.shouldDebugBreak = m_config->shouldDebugBreak();
        reaction.shouldThrow = aborting() || (m_lastAssertionInfo.resultDisposition & ResultDisposition::Normal);
    }